

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  tRowcnt *ptVar2;
  sqlite3 *psVar3;
  int iChng_00;
  int iVar4;
  Stat4Accum *p_00;
  sqlite3_int64 iRowid;
  u8 *pData;
  u32 uVar5;
  tRowcnt nLt;
  int iChng;
  Stat4Accum *p;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  p_00 = (Stat4Accum *)sqlite3_value_blob(*argv);
  iChng_00 = sqlite3_value_int(argv[1]);
  if (p_00->nRow == 0) {
    for (p._4_4_ = 0; p._4_4_ < p_00->nCol; p._4_4_ = p._4_4_ + 1) {
      (p_00->current).anEq[p._4_4_] = 1;
    }
  }
  else {
    samplePushPrevious(p_00,iChng_00);
    for (p._4_4_ = 0; iVar4 = iChng_00, p._4_4_ < iChng_00; p._4_4_ = p._4_4_ + 1) {
      ptVar2 = (p_00->current).anEq;
      ptVar2[p._4_4_] = ptVar2[p._4_4_] + 1;
    }
    while (p._4_4_ = iVar4, p._4_4_ < p_00->nCol) {
      ptVar2 = (p_00->current).anDLt;
      ptVar2[p._4_4_] = ptVar2[p._4_4_] + 1;
      ptVar2 = (p_00->current).anLt;
      ptVar2[p._4_4_] = (p_00->current).anEq[p._4_4_] + ptVar2[p._4_4_];
      (p_00->current).anEq[p._4_4_] = 1;
      iVar4 = p._4_4_ + 1;
    }
  }
  p_00->nRow = p_00->nRow + 1;
  iVar4 = sqlite3_value_type(argv[2]);
  if (iVar4 == 1) {
    psVar3 = p_00->db;
    iRowid = sqlite3_value_int64(argv[2]);
    sampleSetRowidInt64(psVar3,&p_00->current,iRowid);
  }
  else {
    psVar3 = p_00->db;
    iVar4 = sqlite3_value_bytes(argv[2]);
    pData = (u8 *)sqlite3_value_blob(argv[2]);
    sampleSetRowid(psVar3,&p_00->current,iVar4,pData);
  }
  uVar5 = p_00->iPrn * 0x41c64e6d + 0x3039;
  p_00->iPrn = uVar5;
  (p_00->current).iHash = uVar5;
  uVar1 = (p_00->current).anLt[p_00->nCol + -1];
  if (uVar1 / p_00->nPSample != (uVar1 + 1) / p_00->nPSample) {
    (p_00->current).isPSample = '\x01';
    (p_00->current).iCol = 0;
    sampleInsert(p_00,&p_00->current,p_00->nCol + -1);
    (p_00->current).isPSample = '\0';
  }
  for (p._4_4_ = 0; p._4_4_ < p_00->nCol + -1; p._4_4_ = p._4_4_ + 1) {
    (p_00->current).iCol = p._4_4_;
    if ((iChng_00 <= p._4_4_) ||
       (iVar4 = sampleIsBetterPost(p_00,&p_00->current,p_00->aBest + p._4_4_), iVar4 != 0)) {
      sampleCopy(p_00,p_00->aBest + p._4_4_,&p_00->current);
    }
  }
  return;
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
  }else{
    /* Second and subsequent calls get processed here */
    samplePushPrevious(p, iChng);

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
      p->current.anLt[i] += p->current.anEq[i];
#endif
      p->current.anEq[i] = 1;
    }
  }
  p->nRow++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
    sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
  }else{
    sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                       sqlite3_value_blob(argv[2]));
  }
  p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;
#endif

#ifdef SQLITE_ENABLE_STAT4
  {
    tRowcnt nLt = p->current.anLt[p->nCol-1];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }
#endif
}